

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namespaces.h
# Opt level: O3

Matrix<long_double> * __thiscall
neural_networks::utilities::Matrix<long_double>::transpose(Matrix<long_double> *this)

{
  size_type __n;
  size_t sVar1;
  pointer pvVar2;
  size_t sVar3;
  Matrix<long_double> *this_00;
  size_t sVar4;
  longdouble *plVar5;
  pointer pvVar6;
  size_t sVar7;
  vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
  temp_vector;
  allocator_type local_42;
  allocator_type local_41;
  vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
  local_40;
  vector<long_double,_std::allocator<long_double>_> local_28;
  
  __n = this->M;
  std::vector<long_double,_std::allocator<long_double>_>::vector(&local_28,this->N,&local_41);
  std::
  vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
  ::vector(&local_40,__n,&local_28,&local_42);
  if (local_28.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  sVar1 = this->N;
  if (sVar1 != 0) {
    pvVar2 = (this->matrix).
             super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    sVar3 = this->M;
    sVar4 = 0;
    do {
      if (sVar3 != 0) {
        plVar5 = pvVar2[sVar4].super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl
                 .super__Vector_impl_data._M_start;
        pvVar6 = local_40.
                 super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        sVar7 = sVar3;
        do {
          (pvVar6->super__Vector_base<long_double,_std::allocator<long_double>_>)._M_impl.
          super__Vector_impl_data._M_start[sVar4] = *plVar5;
          plVar5 = plVar5 + 1;
          pvVar6 = pvVar6 + 1;
          sVar7 = sVar7 - 1;
        } while (sVar7 != 0);
      }
      sVar4 = sVar4 + 1;
    } while (sVar4 != sVar1);
  }
  this_00 = (Matrix<long_double> *)operator_new(0x30);
  Matrix(this_00,&local_40);
  std::
  vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
  ::~vector(&local_40);
  return this_00;
}

Assistant:

neural_networks::utilities::Matrix<T>* neural_networks::utilities::Matrix<T>::transpose() const {
    std::vector< std::vector<T> > temp_vector(M, std::vector<T>(N));
    register size_t i, j;
    for(i = 0; i < N; ++i) {
        for(j = 0; j < M; ++j) {
            temp_vector[j][i] = matrix[i][j];
        }
    }
    neural_networks::utilities::Matrix<T> *to_return = new neural_networks::utilities::Matrix<T>(temp_vector);
    return to_return;
}